

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
async_accept<asio::basic_socket<asio::ip::tcp>,asio::detail::wrapped_handler<asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>*,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,std::error_code_const&)>,asio::detail::is_continuation_if_running>>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          basic_socket<asio::ip::tcp> *peer,endpoint_type *peer_endpoint,
          wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
          *handler)

{
  undefined1 uVar1;
  bool bVar2;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  *this_00;
  undefined2 uVar3;
  reactor_op *in_RSI;
  long in_RDI;
  ptr p;
  bool is_continuation;
  basic_socket<asio::ip::tcp> *in_stack_ffffffffffffff70;
  wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
  *in_stack_ffffffffffffff80;
  tcp *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
  *in_stack_ffffffffffffffb0;
  
  uVar1 = asio_handler_cont_helpers::
          is_continuation<asio::detail::wrapped_handler<asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>*,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,std::error_code_const&)>,asio::detail::is_continuation_if_running>>
                    ((wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
                      *)0x3010f0);
  this_00 = reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
            ::ptr::allocate(in_stack_ffffffffffffff80);
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  ::reactive_socket_accept_op
            (this_00,(socket_type)((ulong)in_RDI >> 0x20),(state_type)((ulong)in_RDI >> 0x18),
             (basic_socket<asio::ip::tcp> *)
             CONCAT17(in_stack_ffffffffffffff97,
                      CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
             in_stack_ffffffffffffff88,(endpoint *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffffb0);
  uVar3 = (undefined2)((ulong)(in_RDI + 0x28) >> 0x30);
  bVar2 = basic_socket<asio::ip::tcp>::is_open(in_stack_ffffffffffffff70);
  reactive_socket_service_base::start_accept_op
            ((reactive_socket_service_base *)
             CONCAT17(bVar2,CONCAT16(uVar1,in_stack_ffffffffffffff90)),
             (base_implementation_type *)this_00,in_RSI,SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  ::ptr::~ptr((ptr *)0x3011e5);
  return;
}

Assistant:

void async_accept(implementation_type& impl, Socket& peer,
      endpoint_type* peer_endpoint, Handler& handler)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_accept_op<Socket, Protocol, Handler> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(impl.socket_, impl.state_, peer,
        impl.protocol_, peer_endpoint, handler);

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_accept"));

    start_accept_op(impl, p.p, is_continuation, peer.is_open());
    p.v = p.p = 0;
  }